

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebook.c
# Opt level: O2

long vorbis_book_decodev_set(codebook *book,float *a,oggpack_buffer *b,int n)

{
  float *pfVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  
  if (book->used_entries < 1) {
    uVar5 = (ulong)(uint)n;
    if (n < 1) {
      uVar5 = 0;
    }
    for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      a[uVar4] = 0.0;
    }
  }
  else {
    for (iVar7 = 0; iVar7 < n; iVar7 = iVar7 + (int)lVar6) {
      lVar2 = decode_packed_entry_number(book,b);
      if ((int)lVar2 == -1) {
        return -1;
      }
      lVar3 = book->dim;
      lVar2 = (int)lVar2 * lVar3;
      pfVar1 = book->valuelist;
      if (lVar3 < 1) {
        lVar3 = 0;
      }
      for (lVar6 = 0; (iVar7 + lVar6 < (long)n && (lVar3 != lVar6)); lVar6 = lVar6 + 1) {
        a[iVar7 + lVar6] = pfVar1[lVar2 + lVar6];
      }
    }
  }
  return 0;
}

Assistant:

long vorbis_book_decodev_set(codebook *book,float *a,oggpack_buffer *b,int n){
  if(book->used_entries>0){
    int i,j,entry;
    float *t;

    for(i=0;i<n;){
      entry = decode_packed_entry_number(book,b);
      if(entry==-1)return(-1);
      t     = book->valuelist+entry*book->dim;
      for (j=0;i<n && j<book->dim;){
        a[i++]=t[j++];
      }
    }
  }else{
    int i;

    for(i=0;i<n;){
      a[i++]=0.f;
    }
  }
  return(0);
}